

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_midistream.cpp
# Opt level: O0

void __thiscall MIDIStreamer::MusicVolumeChanged(MIDIStreamer *this)

{
  uint uVar1;
  float fVar2;
  float realvolume;
  MIDIStreamer *this_local;
  
  if ((this->MIDI == (MIDIDevice *)0x0) ||
     (uVar1 = (*this->MIDI->_vptr_MIDIDevice[0xe])(), (uVar1 & 1) == 0)) {
    this->Volume = 0xffff;
  }
  else {
    fVar2 = FFloatCVar::operator_cast_to_float(&snd_musicvolume);
    fVar2 = clamp<float>(fVar2 * relative_volume,0.0,1.0);
    uVar1 = clamp<unsigned_int>((uint)(long)(fVar2 * 65535.0),0,0xffff);
    this->Volume = uVar1;
  }
  if ((this->super_MusInfo).m_Status == STATE_Playing) {
    OutputVolume(this,this->Volume);
  }
  return;
}

Assistant:

void MIDIStreamer::MusicVolumeChanged()
{
	if (MIDI != NULL && MIDI->FakeVolume())
	{
		float realvolume = clamp<float>(snd_musicvolume * relative_volume, 0.f, 1.f);
		Volume = clamp<DWORD>((DWORD)(realvolume * 65535.f), 0, 65535);
	}
	else
	{
		Volume = 0xFFFF;
	}
	if (m_Status == STATE_Playing)
	{
		OutputVolume(Volume);
	}
}